

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

void __thiscall
llbuild::core::TaskInterface::spawn(TaskInterface *this,QueueJob *job,QueueJobPriority priority)

{
  ExecutionQueue *pEVar1;
  QueueJob local_48;
  QueueJobPriority local_1c;
  QueueJob *pQStack_18;
  QueueJobPriority priority_local;
  QueueJob *job_local;
  TaskInterface *this_local;
  
  local_1c = priority;
  pQStack_18 = job;
  job_local = (QueueJob *)this;
  pEVar1 = anon_unknown.dwarf_33c573::BuildEngineImpl::getExecutionQueue
                     ((BuildEngineImpl *)this->impl);
  llbuild::basic::QueueJob::QueueJob(&local_48,pQStack_18);
  (*pEVar1->_vptr_ExecutionQueue[2])(pEVar1,&local_48,(ulong)local_1c);
  llbuild::basic::QueueJob::~QueueJob(&local_48);
  return;
}

Assistant:

void TaskInterface::spawn(basic::QueueJob&& job, basic::QueueJobPriority priority) {
  // FIXME: handle environment
  static_cast<BuildEngineImpl*>(impl)->getExecutionQueue().addJob(std::move(job), priority);
}